

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::_InternalSerialize
          (SoundAnalysisPreprocessing *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint value;
  SoundAnalysisPreprocessing_Vggish *this_00;
  void *data;
  ulong uVar1;
  int size;
  uint8_t *puVar2;
  size_t __n;
  
  if (this->_oneof_case_[0] == 0x14) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = (this->SoundAnalysisPreprocessingType_).vggish_;
    target[0] = 0xa2;
    target[1] = '\x01';
    value = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[2] = (uint8_t)value;
    if (value < 0x80) {
      puVar2 = target + 3;
    }
    else {
      puVar2 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (value,target + 2);
    }
    target = SoundAnalysisPreprocessing_Vggish::_InternalSerialize(this_00,puVar2,stream);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = uVar1 & 0xfffffffffffffffc;
    data = *(void **)(uVar1 + 8);
    size = (int)*(undefined8 *)(uVar1 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar2;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* SoundAnalysisPreprocessing::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing.Vggish vggish = 20;
  if (_internal_has_vggish()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        20, _Internal::vggish(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
  return target;
}